

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransport_AMQP_Common_SetOption(TRANSPORT_LL_HANDLE handle,char *option,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  char *copied_proxy_password;
  char *copied_proxy_username;
  char *copied_proxy_hostname;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  HTTP_PROXY_OPTIONS *proxy_options;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_TRANSPORT_INSTANCE *pAStack_40;
  _Bool is_device_specific_option;
  AMQP_TRANSPORT_INSTANCE *transport_instance;
  LOGGER_LOG l;
  double *pdStack_28;
  IOTHUB_CLIENT_RESULT result;
  void *value_local;
  char *option_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  pdStack_28 = (double *)value;
  value_local = option;
  option_local = (char *)handle;
  if (((handle == (TRANSPORT_LL_HANDLE)0x0) || (option == (char *)0x0)) || (value == (void *)0x0)) {
    transport_instance = (AMQP_TRANSPORT_INSTANCE *)xlogging_get_log_function();
    if (transport_instance != (AMQP_TRANSPORT_INSTANCE *)0x0) {
      (*(code *)transport_instance)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_SetOption",0x726,1,
                 "Invalid parameter (NULL) passed to AMQP transport SetOption (handle=%p, options=%p, value=%p)"
                 ,option_local,value_local,pdStack_28);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    pAStack_40 = (AMQP_TRANSPORT_INSTANCE *)handle;
    iVar1 = strcmp(OPTION_CBS_REQUEST_TIMEOUT,option);
    if (iVar1 == 0) {
      l_1._7_1_ = true;
      pAStack_40->option_cbs_request_timeout_secs = (size_t)*pdStack_28;
    }
    else {
      iVar1 = strcmp(OPTION_EVENT_SEND_TIMEOUT_SECS,(char *)value_local);
      l_1._7_1_ = iVar1 == 0;
      if ((bool)l_1._7_1_) {
        pAStack_40->option_send_event_timeout_secs = (size_t)*pdStack_28;
      }
    }
    if ((bool)l_1._7_1_ == false) {
      iVar1 = strcmp(OPTION_RETRY_INTERVAL_SEC,(char *)value_local);
      if (iVar1 == 0) {
        iVar1 = retry_control_set_option
                          (pAStack_40->connection_retry_control,
                           RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS,pdStack_28);
        if (iVar1 == 0) {
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          l_3 = xlogging_get_log_function();
          if (l_3 != (LOGGER_LOG)0x0) {
            (*l_3)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                   ,"IoTHubTransport_AMQP_Common_SetOption",0x74d,1,
                   "Failure setting retry interval option");
          }
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
      else {
        iVar1 = strcmp(OPTION_RETRY_MAX_DELAY_SECS,(char *)value_local);
        if (iVar1 == 0) {
          iVar1 = retry_control_set_option
                            (pAStack_40->connection_retry_control,
                             RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS,pdStack_28);
          if (iVar1 == 0) {
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            l_4 = xlogging_get_log_function();
            if (l_4 != (LOGGER_LOG)0x0) {
              (*l_4)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                     ,"IoTHubTransport_AMQP_Common_SetOption",0x759,1,
                     "Failure setting retry max delay option");
            }
            l._4_4_ = IOTHUB_CLIENT_ERROR;
          }
        }
        else {
          iVar1 = strcmp(OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS,(char *)value_local);
          if ((iVar1 == 0) ||
             (iVar1 = strcmp(OPTION_C2D_KEEP_ALIVE_FREQ_SECS,(char *)value_local), iVar1 == 0)) {
            pAStack_40->svc2cl_keep_alive_timeout_secs = (size_t)*pdStack_28;
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            iVar1 = strcmp(OPTION_REMOTE_IDLE_TIMEOUT_RATIO,(char *)value_local);
            if (iVar1 == 0) {
              if ((*pdStack_28 <= 0.0) || (0.9 <= *pdStack_28)) {
                l_5 = xlogging_get_log_function();
                if (l_5 != (LOGGER_LOG)0x0) {
                  (*l_5)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_SetOption",0x76b,1,
                         "Invalid remote idle ratio %lf",*pdStack_28);
                }
                l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
              }
              else {
                pAStack_40->cl2svc_keep_alive_send_ratio = *pdStack_28;
                l._4_4_ = IOTHUB_CLIENT_OK;
              }
            }
            else {
              iVar1 = strcmp(OPTION_LOG_TRACE,(char *)value_local);
              if (iVar1 == 0) {
                pAStack_40->is_trace_on = (_Bool)(*(byte *)pdStack_28 & 1);
                if ((pAStack_40->amqp_connection == (AMQP_CONNECTION_HANDLE)0x0) ||
                   (iVar1 = amqp_connection_set_logging
                                      (pAStack_40->amqp_connection,
                                       (_Bool)(pAStack_40->is_trace_on & 1)), iVar1 == 0)) {
                  l._4_4_ = IOTHUB_CLIENT_OK;
                }
                else {
                  proxy_options = (HTTP_PROXY_OPTIONS *)xlogging_get_log_function();
                  if (proxy_options != (HTTP_PROXY_OPTIONS *)0x0) {
                    (*(code *)proxy_options)
                              (0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                               ,"IoTHubTransport_AMQP_Common_SetOption",0x77c,1,
                               "transport failed setting option \'%s\' (amqp_connection_set_logging failed)"
                               ,value_local);
                  }
                  l._4_4_ = IOTHUB_CLIENT_ERROR;
                }
              }
              else {
                iVar1 = strcmp("proxy_data",(char *)value_local);
                if (iVar1 == 0) {
                  l_6 = (LOGGER_LOG)pdStack_28;
                  if (pAStack_40->tls_io == (XIO_HANDLE)0x0) {
                    if (*pdStack_28 == 0.0) {
                      l_8 = xlogging_get_log_function();
                      if (l_8 != (LOGGER_LOG)0x0) {
                        (*l_8)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                               ,"IoTHubTransport_AMQP_Common_SetOption",0x78f,1,
                               "NULL host_address in proxy options");
                      }
                      l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                    }
                    else if (((pdStack_28[2] == 0.0) || (pdStack_28[3] == 0.0)) &&
                            (pdStack_28[2] != pdStack_28[3])) {
                      copied_proxy_hostname = (char *)xlogging_get_log_function();
                      if ((LOGGER_LOG)copied_proxy_hostname != (LOGGER_LOG)0x0) {
                        (*(code *)copied_proxy_hostname)
                                  (AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                   ,"IoTHubTransport_AMQP_Common_SetOption",0x795,1,
                                   "Only one of username and password for proxy settings was NULL");
                      }
                      l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                    }
                    else {
                      copied_proxy_username = (char *)0x0;
                      copied_proxy_password = (char *)0x0;
                      l_9 = (LOGGER_LOG)0x0;
                      pAStack_40->http_proxy_port = *(int *)(pdStack_28 + 1);
                      iVar1 = mallocAndStrcpy_s(&copied_proxy_username,(char *)*pdStack_28);
                      if (iVar1 == 0) {
                        if ((*(long *)(l_6 + 0x10) == 0) ||
                           (iVar1 = mallocAndStrcpy_s(&copied_proxy_password,*(char **)(l_6 + 0x10))
                           , iVar1 == 0)) {
                          if ((*(long *)(l_6 + 0x18) == 0) ||
                             (iVar1 = mallocAndStrcpy_s((char **)&l_9,*(char **)(l_6 + 0x18)),
                             iVar1 == 0)) {
                            free_proxy_data(pAStack_40);
                            pAStack_40->http_proxy_hostname = copied_proxy_username;
                            pAStack_40->http_proxy_username = copied_proxy_password;
                            pAStack_40->http_proxy_password = (char *)l_9;
                            l._4_4_ = IOTHUB_CLIENT_OK;
                          }
                          else {
                            if (copied_proxy_password != (char *)0x0) {
                              free(copied_proxy_password);
                            }
                            free(copied_proxy_username);
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                        ,"IoTHubTransport_AMQP_Common_SetOption",0x7b1,1,
                                        "Cannot copy HTTP proxy password");
                            }
                            l._4_4_ = IOTHUB_CLIENT_ERROR;
                          }
                        }
                        else {
                          free(copied_proxy_username);
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                      ,"IoTHubTransport_AMQP_Common_SetOption",0x7a7,1,
                                      "Cannot copy HTTP proxy username");
                          }
                          l._4_4_ = IOTHUB_CLIENT_ERROR;
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                    ,"IoTHubTransport_AMQP_Common_SetOption",0x7a1,1,
                                    "Cannot copy HTTP proxy hostname");
                        }
                        l._4_4_ = IOTHUB_CLIENT_ERROR;
                      }
                    }
                  }
                  else {
                    l_7 = xlogging_get_log_function();
                    if (l_7 != (LOGGER_LOG)0x0) {
                      (*l_7)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                             ,"IoTHubTransport_AMQP_Common_SetOption",0x78a,1,
                             "Cannot set proxy option once the underlying IO is created");
                    }
                    l._4_4_ = IOTHUB_CLIENT_ERROR;
                  }
                }
                else {
                  l._4_4_ = IOTHUB_CLIENT_OK;
                  iVar1 = strcmp(OPTION_X509_CERT,(char *)value_local);
                  if ((iVar1 == 0) ||
                     (iVar1 = strcmp(OPTION_X509_PRIVATE_KEY,(char *)value_local), iVar1 == 0)) {
                    if (pAStack_40->preferred_authentication_mode ==
                        AMQP_TRANSPORT_AUTHENTICATION_MODE_NOT_SET) {
                      pAStack_40->preferred_authentication_mode =
                           AMQP_TRANSPORT_AUTHENTICATION_MODE_X509;
                    }
                    else if (pAStack_40->preferred_authentication_mode ==
                             AMQP_TRANSPORT_AUTHENTICATION_MODE_X509) {
                      IoTHubClient_Auth_Set_x509_Type(pAStack_40->authorization_module,true);
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                  ,"IoTHubTransport_AMQP_Common_SetOption",0x7cc,1,
                                  "transport failed setting option \'%s\' (preferred authentication method is not x509)"
                                  ,value_local);
                      }
                      l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                    }
                  }
                  if (l._4_4_ != IOTHUB_CLIENT_INVALID_ARG) {
                    if ((pAStack_40->tls_io == (XIO_HANDLE)0x0) &&
                       (iVar1 = get_new_underlying_io_transport(pAStack_40,&pAStack_40->tls_io),
                       iVar1 != 0)) {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                  ,"IoTHubTransport_AMQP_Common_SetOption",0x7da,1,
                                  "transport failed setting option \'%s\' (failed to obtain a TLS I/O transport)."
                                  ,value_local);
                      }
                      l._4_4_ = IOTHUB_CLIENT_ERROR;
                    }
                    else {
                      iVar1 = xio_setoption(pAStack_40->tls_io,(char *)value_local,pdStack_28);
                      if (iVar1 == 0) {
                        iVar1 = save_underlying_io_transport_options(pAStack_40);
                        if ((iVar1 != 0) &&
                           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                    ,"IoTHubTransport_AMQP_Common_SetOption",0x7e6,1,
                                    "IoTHubTransport_AMQP_Common_SetOption failed to save underlying I/O options; failure will be ignored"
                                   );
                        }
                        l._4_4_ = IOTHUB_CLIENT_OK;
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                                    ,"IoTHubTransport_AMQP_Common_SetOption",0x7df,1,
                                    "transport failed setting option \'%s\' (xio_setoption failed)",
                                    value_local);
                        }
                        l._4_4_ = IOTHUB_CLIENT_ERROR;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = IoTHubTransport_AMQP_Common_Device_SetOption
                        (option_local,(char *)value_local,pdStack_28);
      if (iVar1 == 0) {
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_SetOption",0x741,1,
                 "transport failed setting option \'%s\' (failed setting option on one or more registered devices)"
                 ,value_local);
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_AMQP_Common_SetOption(TRANSPORT_LL_HANDLE handle, const char* option, const void* value)
{
    IOTHUB_CLIENT_RESULT result;

    if ((handle == NULL) || (option == NULL) || (value == NULL))
    {
        LogError("Invalid parameter (NULL) passed to AMQP transport SetOption (handle=%p, options=%p, value=%p)", handle, option, value);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport_instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        bool is_device_specific_option;

        if (strcmp(OPTION_CBS_REQUEST_TIMEOUT, option) == 0)
        {
            is_device_specific_option = true;
            transport_instance->option_cbs_request_timeout_secs = *(size_t*)value;
        }
        else if (strcmp(OPTION_EVENT_SEND_TIMEOUT_SECS, option) == 0)
        {
            is_device_specific_option = true;
            transport_instance->option_send_event_timeout_secs = *(size_t*)value;
        }
        else
        {
            is_device_specific_option = false;
        }

        if (is_device_specific_option)
        {
            if (IoTHubTransport_AMQP_Common_Device_SetOption(handle, option, (void*)value) != RESULT_OK)
            {
                LogError("transport failed setting option '%s' (failed setting option on one or more registered devices)", option);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_RETRY_INTERVAL_SEC, option) == 0)
        {
            if (retry_control_set_option(transport_instance->connection_retry_control, RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry interval option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_RETRY_MAX_DELAY_SECS, option) == 0)
        {
            if (retry_control_set_option(transport_instance->connection_retry_control, RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry max delay option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if ((strcmp(OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS, option) == 0) || (strcmp(OPTION_C2D_KEEP_ALIVE_FREQ_SECS, option) == 0))
        {
            transport_instance->svc2cl_keep_alive_timeout_secs = *(size_t*)value;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_REMOTE_IDLE_TIMEOUT_RATIO, option) == 0)
        {

            if ((*(double*)value <= 0.0) || (*(double*)value >= MAX_SERVICE_KEEP_ALIVE_RATIO))
            {
                LogError("Invalid remote idle ratio %lf", *(double*) value);
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                transport_instance->cl2svc_keep_alive_send_ratio = *(double*)value; // override the default and set the user configured remote idle ratio value
                result = IOTHUB_CLIENT_OK;
            }

        }
        else if (strcmp(OPTION_LOG_TRACE, option) == 0)
        {
            transport_instance->is_trace_on = *((bool*)value);

            if (transport_instance->amqp_connection != NULL &&
                amqp_connection_set_logging(transport_instance->amqp_connection, transport_instance->is_trace_on) != RESULT_OK)
            {
                LogError("transport failed setting option '%s' (amqp_connection_set_logging failed)", option);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, option) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_options = (HTTP_PROXY_OPTIONS*)value;

            if (transport_instance->tls_io != NULL)
            {
                LogError("Cannot set proxy option once the underlying IO is created");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if (proxy_options->host_address == NULL)
            {
                LogError("NULL host_address in proxy options");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (((proxy_options->username == NULL) || (proxy_options->password == NULL)) &&
                (proxy_options->username != proxy_options->password))
            {
                LogError("Only one of username and password for proxy settings was NULL");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* copied_proxy_hostname = NULL;
                char* copied_proxy_username = NULL;
                char* copied_proxy_password = NULL;

                transport_instance->http_proxy_port = proxy_options->port;
                if (mallocAndStrcpy_s(&copied_proxy_hostname, proxy_options->host_address) != 0)
                {
                    LogError("Cannot copy HTTP proxy hostname");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->username != NULL) && (mallocAndStrcpy_s(&copied_proxy_username, proxy_options->username) != 0))
                {
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy username");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->password != NULL) && (mallocAndStrcpy_s(&copied_proxy_password, proxy_options->password) != 0))
                {
                    if (copied_proxy_username != NULL)
                    {
                        free(copied_proxy_username);
                    }
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy password");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    free_proxy_data(transport_instance);

                    transport_instance->http_proxy_hostname = copied_proxy_hostname;
                    transport_instance->http_proxy_username = copied_proxy_username;
                    transport_instance->http_proxy_password = copied_proxy_password;

                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else
        {
            result = IOTHUB_CLIENT_OK;

            if (strcmp(OPTION_X509_CERT, option) == 0 || strcmp(OPTION_X509_PRIVATE_KEY, option) == 0)
            {
                if (transport_instance->preferred_authentication_mode == AMQP_TRANSPORT_AUTHENTICATION_MODE_NOT_SET)
                {
                    transport_instance->preferred_authentication_mode = AMQP_TRANSPORT_AUTHENTICATION_MODE_X509;
                }
                else if (transport_instance->preferred_authentication_mode != AMQP_TRANSPORT_AUTHENTICATION_MODE_X509)
                {
                    LogError("transport failed setting option '%s' (preferred authentication method is not x509)", option);
                    result = IOTHUB_CLIENT_INVALID_ARG;
                }
                else
                {
                    IoTHubClient_Auth_Set_x509_Type(transport_instance->authorization_module, true);
                }
            }

            if (result != IOTHUB_CLIENT_INVALID_ARG)
            {
                if (transport_instance->tls_io == NULL &&
                    get_new_underlying_io_transport(transport_instance, &transport_instance->tls_io) != RESULT_OK)
                {
                    LogError("transport failed setting option '%s' (failed to obtain a TLS I/O transport).", option);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if (xio_setoption(transport_instance->tls_io, option, value) != RESULT_OK)
                {
                    LogError("transport failed setting option '%s' (xio_setoption failed)", option);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (save_underlying_io_transport_options(transport_instance) != RESULT_OK)
                    {
                        LogError("IoTHubTransport_AMQP_Common_SetOption failed to save underlying I/O options; failure will be ignored");
                    }

                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }

    return result;
}